

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::MaterialBinding::set_materialBinding
          (MaterialBinding *this,Relationship *rel,token *mat_purpose)

{
  bool bVar1;
  mapped_type *this_00;
  
  if ((mat_purpose->str_)._M_string_length != 0) {
    bVar1 = ::std::operator==(&mat_purpose->str_,"full");
    if (!bVar1) {
      bVar1 = ::std::operator==(&mat_purpose->str_,"preview");
      if (!bVar1) {
        this_00 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
                  ::operator[](&this->_materialBindingMap,&mat_purpose->str_);
        Relationship::operator=(this_00,rel);
        return;
      }
    }
    this = (MaterialBinding *)&this->materialBindingFull;
  }
  nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=(&this->materialBinding,rel);
  return;
}

Assistant:

void set_materialBinding(const Relationship &rel, const value::token &mat_purpose) {

    if (mat_purpose.str().empty()) {
      return set_materialBinding(rel);
    } else if (mat_purpose.str() == "full") {
      return set_materialBindingFull(rel);
    } else if (mat_purpose.str() == "preview") {
      return set_materialBindingFull(rel);
    } else {
      _materialBindingMap[mat_purpose.str()] = rel;
    }
  }